

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int tlsio_openssl_init(void)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  
  OPENSSL_init_ssl(0);
  OPENSSL_init_ssl(0x200002,0);
  ERR_load_BIO_strings();
  OPENSSL_init_crypto(0xc,0);
  iVar1 = openssl_static_locks_install();
  if (iVar1 == 0) {
    openssl_dynamic_locks_install();
    l._4_4_ = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_init",0x4dd,1,"Failed to install static locks in OpenSSL!");
    }
    l._4_4_ = 0x4de;
  }
  return l._4_4_;
}

Assistant:

int tlsio_openssl_init(void)
{
    (void)SSL_library_init();

    SSL_load_error_strings();
    ERR_load_BIO_strings();
    OpenSSL_add_all_algorithms();

    if (openssl_static_locks_install() != 0)
    {
        LogInfo("Failed to install static locks in OpenSSL!");
        return MU_FAILURE;
    }

    openssl_dynamic_locks_install();
    return 0;
}